

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_brodnik.h
# Opt level: O3

uchar * __thiscall
vector_brodnik<unsigned_char_*>::operator[](vector_brodnik<unsigned_char_*> *this,size_t index)

{
  pointer pppuVar1;
  uint uVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  
  if (((long)(2 << (this->_superblock & 0x1f)) -
      ((ulong)this->_left_in_superblock * this->_block_size + this->_left_in_block)) - 0x40 <= index
     ) {
    __assert_fail("index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_brodnik.h"
                  ,0x65,
                  "T vector_brodnik<unsigned char *>::operator[](size_t) const [T = unsigned char *]"
                 );
  }
  uVar2 = 0x1f;
  uVar6 = (uint)(index + 0x40);
  if (uVar6 != 0) {
    for (; uVar6 >> uVar2 == 0; uVar2 = uVar2 - 1) {
    }
  }
  bVar3 = (byte)(uVar2 >> 1);
  bVar4 = (char)uVar2 - bVar3;
  uVar5 = ((ulong)((uVar6 & ~(1 << (uVar2 & 0x1f))) >> (bVar4 & 0x3f)) +
          (ulong)(((uVar2 & 1 | 2) << (bVar3 & 0x1f)) - 2)) - 0xe;
  pppuVar1 = (this->_index_block).
             super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (uVar5 < (ulong)((long)(this->_index_block).
                            super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pppuVar1 >> 3)) {
    return pppuVar1[uVar5][index + 0x40 & ~(-1L << (bVar4 & 0x3f))];
  }
  __assert_fail("(p+b-SkippedDatablocks) < _index_block.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/vector_brodnik.h"
                ,0x76,
                "T vector_brodnik<unsigned char *>::operator[](size_t) const [T = unsigned char *]")
  ;
}

Assistant:

T operator[](size_t index) const
	{
		// See the paper for details.
		assert(index < size());
		const size_t r = index+1+SkippedElements;
		const unsigned k = 31 - __builtin_clz(r);
		const unsigned msbit = 1 << (31 - __builtin_clz(r));
		const size_t b = (r & ~msbit) >> (k-k/2);
		const size_t e = ~((~size_t(0) >> (k-k/2)) << (k-k/2)) & r;
		const size_t p = k&1 ? (3*(1<<(k>>1))-2) : ((1<<((k>>1)+1))-2);
		/*
		std::cerr<<__func__<<"\n"
			<<"\tindex="<<index<<"\n"
			<<"\tr    ="<<r<<"\n"
			<<"\tk    ="<<k<<"\n"
			<<"\tmsbit="<<msbit<<"\n"
			<<"\tb    ="<<b<<"\n"
			<<"\te    ="<<e<<"\n"
			<<"\tp    ="<<p<<"\n\n";
		*/
		assert((p+b-SkippedDatablocks) < _index_block.size());
		return _index_block[p+b-SkippedDatablocks][e];
	}